

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhash_kv_open(unqlite_kv_engine *pEngine,pgno dbSize)

{
  int iVar1;
  unqlite_page *puStack_30;
  int rc;
  unqlite_page *pHeader;
  lhash_kv_engine *pHash;
  pgno dbSize_local;
  unqlite_kv_engine *pEngine_local;
  
  pHeader = (unqlite_page *)pEngine;
  pHash = (lhash_kv_engine *)dbSize;
  dbSize_local = (pgno)pEngine;
  if (dbSize == 0) {
    iVar1 = (*pEngine->pIo->xNew)(pEngine->pIo->pHandle,&stack0xffffffffffffffd0);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = (**(code **)(*(long *)dbSize_local + 0x28))(puStack_30);
    if (iVar1 != 0) {
      return iVar1;
    }
    pEngine_local._4_4_ = lhash_write_header((lhash_kv_engine *)pHeader,puStack_30);
  }
  else {
    iVar1 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,1,&stack0xffffffffffffffd0);
    if (iVar1 != 0) {
      return iVar1;
    }
    pEngine_local._4_4_ = lhash_read_header((lhash_kv_engine *)pHeader,puStack_30);
  }
  if (pEngine_local._4_4_ == 0) {
    pEngine_local._4_4_ = 0;
  }
  return pEngine_local._4_4_;
}

Assistant:

static int lhash_kv_open(unqlite_kv_engine *pEngine,pgno dbSize)
{
	lhash_kv_engine *pHash = (lhash_kv_engine *)pEngine;
	unqlite_page *pHeader;
	int rc;
	if( dbSize < 1 ){
		/* A new database, create the header */
		rc = pEngine->pIo->xNew(pEngine->pIo->pHandle,&pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Acquire a writer lock */
		rc = pEngine->pIo->xWrite(pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Write the hash header */
		rc = lhash_write_header(pHash,pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}else{
		/* Acquire the page one of the database */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Read the database header */
		rc = lhash_read_header(pHash,pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	return UNQLITE_OK;
}